

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::print(Interpreter *this)

{
  ostream *poVar1;
  uint uVar2;
  
  uVar2 = this->stackPos;
  std::operator<<((ostream *)&std::cout,"^^^^^^stack^^^^^^\n");
  for (; 0 < (int)uVar2; uVar2 = uVar2 - 4) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(float *)((long)this->stack + (ulong)uVar2));
    std::operator<<(poVar1,'\n');
  }
  std::operator<<((ostream *)&std::cout,"^^^^^^^^^^^^^^^^^\n");
  return;
}

Assistant:

void Interpreter::print() {
/*    std::cout << "=====vars=====\n";
    std::map<unsigned int, void *>::iterator it = vars.begin();
    while (it != vars.end()) {
        float f;
        memcpy(&f, it->second, 4);
        std::cout << it->first << " -> " << f << '\n';
        it = std::next(it);
    }

    std::cout << "==============\n";*/

    int pos = stackPos;
    std::cout << "^^^^^^stack^^^^^^\n";
    while (pos > 0) {
        std::cout << *(float *) stackAt(pos) << '\n';
        pos -= 4;
    }
    std::cout << "^^^^^^^^^^^^^^^^^\n";
}